

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O1

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::~WebSocket
          (WebSocket<webfront::networking::TCPNetworkingTS> *this)

{
  _Manager_type p_Var1;
  pointer pbVar2;
  double in_XMM0_Qa;
  
  if (log::logTypeEnabled._4_1_ == '\x01') {
    log::anon_unknown_4::log(in_XMM0_Qa);
  }
  p_Var1 = (this->closeHandler).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->closeHandler,(_Any_data *)&this->closeHandler,__destroy_functor);
  }
  p_Var1 = (this->binaryHandler).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->binaryHandler,(_Any_data *)&this->binaryHandler,__destroy_functor)
    ;
  }
  p_Var1 = (this->textHandler).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->textHandler,(_Any_data *)&this->textHandler,__destroy_functor);
  }
  pbVar2 = (this->decoder).payloadBuffer.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (pointer)0x0) {
    operator_delete(pbVar2,(long)(this->decoder).payloadBuffer.
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pbVar2);
  }
  http::std::experimental::net::v1::
  basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  ::~basic_io_object((basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                      *)this);
  return;
}

Assistant:

~WebSocket() { log::debug("WebSocket destructor"); }